

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

int prepare_rsa_params(void *rsa,int nid,int save,void **pstr,int *pstrtype)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ASN1_STRING *str_00;
  undefined8 *in_RCX;
  RSA *in_RDI;
  undefined4 *in_R8;
  int i;
  size_t str_sz;
  uchar *str;
  WPACKET pkt;
  ASN1_STRING *astr;
  RSA_PSS_PARAMS_30 *pss;
  WPACKET *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  size_t local_80;
  void *local_78;
  RSA_PSS_PARAMS_30 *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  WPACKET *in_stack_ffffffffffffffb8;
  int local_4;
  
  ossl_rsa_get0_pss_params_30(in_RDI);
  *in_RCX = 0;
  iVar1 = RSA_test_flags(in_RDI,0xf000);
  if (iVar1 == 0) {
    *in_R8 = 5;
    local_4 = 1;
  }
  else if (iVar1 == 0x1000) {
    iVar2 = ossl_rsa_pss_params_30_is_unrestricted
                      ((RSA_PSS_PARAMS_30 *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (iVar2 == 0) {
      local_78 = (void *)0x0;
      local_80 = 0;
      iVar2 = 0;
      while (iVar2 < 2) {
        iVar4 = iVar2;
        if (iVar2 == 0) {
          iVar3 = WPACKET_init_null_der((WPACKET *)0x31c619);
joined_r0x0031c61c:
          if (iVar3 == 0) goto LAB_0031c717;
        }
        else if (iVar2 == 1) {
          local_78 = CRYPTO_malloc((int)local_80,
                                   "providers/implementations/encode_decode/encode_key2any.c",0x35b)
          ;
          if (local_78 != (void *)0x0) {
            iVar3 = WPACKET_init_der((WPACKET *)CONCAT44(iVar4,iVar1),
                                     (uchar *)CONCAT44(iVar2,in_stack_ffffffffffffff70),
                                     (size_t)in_stack_ffffffffffffff68);
            goto joined_r0x0031c61c;
          }
          goto LAB_0031c717;
        }
        iVar3 = ossl_DER_w_RSASSA_PSS_params
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                           in_stack_ffffffffffffffa8);
        if (((iVar3 == 0) || (iVar3 = WPACKET_finish(in_stack_ffffffffffffff68), iVar3 == 0)) ||
           (iVar3 = WPACKET_get_total_written((WPACKET *)&stack0xffffffffffffff90,&local_80),
           iVar3 == 0)) goto LAB_0031c717;
        WPACKET_cleanup((WPACKET *)CONCAT44(iVar2,in_stack_ffffffffffffff70));
        if (local_80 == 0) break;
        iVar2 = iVar4 + 1;
      }
      str_00 = ASN1_STRING_new();
      if (str_00 == (ASN1_STRING *)0x0) {
LAB_0031c717:
        CRYPTO_free(local_78);
        local_4 = 0;
      }
      else {
        *in_R8 = 0x10;
        ASN1_STRING_set0(str_00,local_78,(int)local_80);
        *in_RCX = str_00;
        local_4 = 1;
      }
    }
    else {
      *in_R8 = 0xffffffff;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int prepare_rsa_params(const void *rsa, int nid, int save,
                              void **pstr, int *pstrtype)
{
    const RSA_PSS_PARAMS_30 *pss = ossl_rsa_get0_pss_params_30((RSA *)rsa);

    *pstr = NULL;

    switch (RSA_test_flags(rsa, RSA_FLAG_TYPE_MASK)) {
    case RSA_FLAG_TYPE_RSA:
        /* If plain RSA, the parameters shall be NULL */
        *pstrtype = V_ASN1_NULL;
        return 1;
    case RSA_FLAG_TYPE_RSASSAPSS:
        if (ossl_rsa_pss_params_30_is_unrestricted(pss)) {
            *pstrtype = V_ASN1_UNDEF;
            return 1;
        } else {
            ASN1_STRING *astr = NULL;
            WPACKET pkt;
            unsigned char *str = NULL;
            size_t str_sz = 0;
            int i;

            for (i = 0; i < 2; i++) {
                switch (i) {
                case 0:
                    if (!WPACKET_init_null_der(&pkt))
                        goto err;
                    break;
                case 1:
                    if ((str = OPENSSL_malloc(str_sz)) == NULL
                        || !WPACKET_init_der(&pkt, str, str_sz)) {
                        goto err;
                    }
                    break;
                }
                if (!ossl_DER_w_RSASSA_PSS_params(&pkt, -1, pss)
                    || !WPACKET_finish(&pkt)
                    || !WPACKET_get_total_written(&pkt, &str_sz))
                    goto err;
                WPACKET_cleanup(&pkt);

                /*
                 * If no PSS parameters are going to be written, there's no
                 * point going for another iteration.
                 * This saves us from getting |str| allocated just to have it
                 * immediately de-allocated.
                 */
                if (str_sz == 0)
                    break;
            }

            if ((astr = ASN1_STRING_new()) == NULL)
                goto err;
            *pstrtype = V_ASN1_SEQUENCE;
            ASN1_STRING_set0(astr, str, (int)str_sz);
            *pstr = astr;

            return 1;
         err:
            OPENSSL_free(str);
            return 0;
        }
    }

    /* Currently unsupported RSA key type */
    return 0;
}